

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip_dll.cpp
# Opt level: O3

laszip_I32 laszip_read_point(laszip_POINTER pointer)

{
  char cVar1;
  char cVar2;
  short sVar3;
  long lVar4;
  ssize_t sVar5;
  size_t in_RCX;
  byte bVar6;
  void *in_RDX;
  laszip_I32 lVar7;
  byte bVar8;
  float fVar9;
  
  lVar7 = 1;
  if (pointer != (laszip_POINTER)0x0) {
    sVar5 = LASreadPoint::read(*(LASreadPoint **)((long)pointer + 0x228),
                               (int)*(undefined8 *)((long)pointer + 0x210),in_RDX,in_RCX);
    if ((char)sVar5 == '\0') {
      snprintf((char *)((long)pointer + 0x248),0x400,"reading point %lld of %lld total points",
               *(undefined8 *)((long)pointer + 0x1a0),*(undefined8 *)((long)pointer + 0x1a8));
    }
    else {
      if (*(char *)((long)pointer + 0xa83) == '\x01') {
        lVar4 = *(long *)((long)pointer + 0x208);
        sVar3 = *(short *)(lVar4 + *(int *)((long)pointer + 0xa88));
        bVar6 = *(byte *)(lVar4 + *(int *)((long)pointer + 0xa8c));
        cVar1 = *(char *)(lVar4 + *(int *)((long)pointer + 0xa90));
        cVar2 = *(char *)(lVar4 + *(int *)((long)pointer + 0xa94));
        if ((long)*(int *)((long)pointer + 0xa98) != -1) {
          *(undefined2 *)((long)pointer + 0x1de) =
               *(undefined2 *)(lVar4 + *(int *)((long)pointer + 0xa98));
        }
        fVar9 = (float)(int)*(char *)((long)pointer + 0x1c0) / 0.006;
        *(short *)((long)pointer + 0x1c4) =
             sVar3 + (short)(int)((double)fVar9 +
                                 *(double *)(&DAT_0014a930 + (ulong)(fVar9 < 0.0) * 8));
        bVar8 = (byte)*(undefined2 *)((long)pointer + 0x1be);
        *(byte *)((long)pointer + 0x1c8) =
             ((bVar8 >> 3 & 7) + bVar6) * '\x10' | (bVar8 & 7) + (bVar6 >> 4) & 0xf;
        bVar6 = (byte)((ushort)*(undefined2 *)((long)pointer + 0x1be) >> 8);
        *(byte *)((long)pointer + 0x1c7) = (bVar6 & 0x1f) + cVar1;
        *(byte *)((long)pointer + 0x1c6) =
             (bVar6 >> 5) << 4 | cVar2 << 7 |
             *(byte *)((long)pointer + 0x1c6) & 3 | cVar2 * '\x02' & 0xcU;
      }
      *(long *)((long)pointer + 0x1a0) = *(long *)((long)pointer + 0x1a0) + 1;
      *(undefined1 *)((long)pointer + 0x248) = 0;
      lVar7 = 0;
    }
  }
  return lVar7;
}

Assistant:

LASZIP_API laszip_I32
laszip_read_point(
    laszip_POINTER                     pointer
)
{
  if (pointer == 0) return 1;
  laszip_dll_struct* laszip_dll = (laszip_dll_struct*)pointer;

  try
  {
    // read the point
    if (!laszip_dll->reader->read(laszip_dll->point_items))
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "reading point %lld of %lld total points", laszip_dll->p_count, laszip_dll->npoints);
      return 1;
    }

    // special recoding of points (in compatibility mode only)

    if (laszip_dll->compatibility_mode)
    {
      I16 scan_angle_remainder;
      U8 extended_returns;
      U8 classification;
      U8 flags_and_channel;
      I32 return_number_increment;
      I32 number_of_returns_increment;
      I32 overlap_bit;
      I32 scanner_channel;

      // instill extended attributes
      struct laszip_point* point = &laszip_dll->point;

      // get extended attributes from extra bytes
      scan_angle_remainder = *((I16*)(point->extra_bytes + laszip_dll->start_scan_angle));
      extended_returns = point->extra_bytes[laszip_dll->start_extended_returns];
      classification = point->extra_bytes[laszip_dll->start_classification];
      flags_and_channel = point->extra_bytes[laszip_dll->start_flags_and_channel];
      if (laszip_dll->start_NIR_band != -1)
      {
        point->rgb[3] = *((U16*)(point->extra_bytes + laszip_dll->start_NIR_band));
      }

      // decompose into individual attributes
      return_number_increment = (extended_returns >> 4) & 0x0F;
      number_of_returns_increment = extended_returns & 0x0F;
      scanner_channel = (flags_and_channel >> 1) & 0x03;
      overlap_bit = flags_and_channel & 0x01;

      // instill into point
      point->extended_scan_angle = scan_angle_remainder + I16_QUANTIZE(((F32)point->scan_angle_rank) / 0.006f);
      point->extended_return_number = return_number_increment + point->return_number;
      point->extended_number_of_returns = number_of_returns_increment + point->number_of_returns;
      point->extended_classification = classification + point->classification;
      point->extended_scanner_channel = scanner_channel;
      point->extended_classification_flags = (overlap_bit << 3) | ((point->withheld_flag) << 2) | ((point->keypoint_flag) << 1) | (point->synthetic_flag);
    }

    laszip_dll->p_count++;
  }
  catch (...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "internal error in laszip_read_point");
    return 1;
  }

  laszip_dll->error[0] = '\0';
  return 0;
}